

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O0

char * __thiscall ON_Locale::GetAppleLocaleName(ON_Locale *this,char *buffer,size_t buffer_capacity)

{
  char *pcVar1;
  char *dest;
  char *local_40;
  char *s;
  char *buffer_end;
  size_t buffer_capacity_local;
  char *buffer_local;
  ON_Locale *this_local;
  
  pcVar1 = LocaleStringBuilderDestEnd(buffer,buffer_capacity);
  dest = LocaleStringBuilder('\0',this->m_language_subtag,9,buffer,pcVar1);
  pcVar1 = LocaleStringBuilder('_',this->m_region_subtag,5,dest,pcVar1);
  local_40 = buffer;
  if (pcVar1 == (char *)0x0) {
    local_40 = (char *)0x0;
  }
  return local_40;
}

Assistant:

const char* ON_Locale::GetAppleLocaleName(
  char* buffer,
  size_t buffer_capacity
  ) const
{
  char* buffer_end = LocaleStringBuilderDestEnd(buffer,buffer_capacity);
  char* s = buffer;
  s = LocaleStringBuilder(ON_LOCALE_SUBTAG(0,m_language_subtag),s,buffer_end);
  // Apple local names omit script


  // Apple local names use an underbar before <REGION>
  // s = LocaleStringBuilder(ON_LOCALE_SUBTAG('-',m_script_subtag),s,buffer_end);
  s = LocaleStringBuilder(ON_LOCALE_SUBTAG('_',m_region_subtag),s,buffer_end);
  return ( nullptr == s ) ? nullptr : buffer;
}